

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_rmq.cpp
# Opt level: O2

void timing_comp(size_t size)

{
  pointer piVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  long lVar5;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var6;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  pointer piVar12;
  vector<int,_std::allocator<int>_> els;
  rmq<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_unsigned_long>
  rmq;
  
  std::chrono::_V2::system_clock::now();
  std::vector<int,_std::allocator<int>_>::vector(&els,size,(allocator_type *)&rmq);
  piVar1 = els.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  for (piVar12 = els.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start; piVar12 != piVar1; piVar12 = piVar12 + 1) {
    iVar2 = rand();
    *piVar12 = iVar2 % 1000;
  }
  std::chrono::_V2::system_clock::now();
  poVar4 = std::operator<<((ostream *)&std::cerr,"Generate input: ");
  poVar4 = std::ostream::_M_insert<long>((long)poVar4);
  std::endl<char,std::char_traits<char>>(poVar4);
  rmq<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_unsigned_long>::
  rmq(&rmq,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
           els.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start,
      (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
      els.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish,
      0x100,8);
  std::chrono::_V2::system_clock::now();
  poVar4 = std::operator<<((ostream *)&std::cerr,"Construction RMQ: ");
  poVar4 = std::ostream::_M_insert<long>((long)poVar4);
  std::endl<char,std::char_traits<char>>(poVar4);
  lVar5 = std::chrono::_V2::system_clock::now();
  uVar9 = 0;
  if (0 < (int)size) {
    uVar9 = size & 0xffffffff;
  }
  while( true ) {
    iVar2 = (int)uVar9;
    uVar9 = (ulong)(iVar2 - 1);
    if (iVar2 == 0) {
      lVar8 = std::chrono::_V2::system_clock::now();
      std::operator<<((ostream *)&std::cout,"RMQ              queries total time: ");
      poVar4 = std::ostream::_M_insert<double>((double)((lVar8 - lVar5) / 1000000) / 1000.0);
      poVar4 = std::operator<<(poVar4,"s");
      std::endl<char,std::char_traits<char>>(poVar4);
      rmq<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_unsigned_long>
      ::~rmq(&rmq);
      std::vector<int,_std::allocator<int>_>::~vector(&els);
      return;
    }
    iVar2 = rand();
    iVar3 = rand();
    iVar10 = (int)((ulong)(long)iVar2 % (size - 2));
    uVar11 = (ulong)iVar10;
    iVar2 = (int)((ulong)(long)iVar3 % (~uVar11 + size)) + iVar10;
    _Var6 = rmq<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_unsigned_long>
            ::query(&rmq,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                         (els.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start + uVar11),
                    (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                    (els.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start + iVar2));
    _Var7 = std::
            __min_element<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                      (els.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start + uVar11,
                       els.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start + iVar2);
    if (*_Var6._M_current != *_Var7._M_current) break;
    poVar4 = std::operator<<((ostream *)&std::cerr,".");
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  poVar4 = std::operator<<((ostream *)&std::cerr,"ERROR: different mins for range(");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar10);
  poVar4 = std::operator<<(poVar4,",");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
  poVar4 = std::operator<<(poVar4,")");
  std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<((ostream *)&std::cerr,"rmq at ");
  poVar4 = std::ostream::_M_insert<long>((long)poVar4);
  poVar4 = std::operator<<(poVar4," = ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,*_Var6._M_current);
  std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<((ostream *)&std::cerr,"mne at ");
  poVar4 = std::ostream::_M_insert<long>((long)poVar4);
  poVar4 = std::operator<<(poVar4," = ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,*_Var7._M_current);
  std::endl<char,std::char_traits<char>>(poVar4);
  exit(1);
}

Assistant:

void timing_comp(std::size_t size)
{
    auto start_time = std::chrono::high_resolution_clock::now();
    std::vector<int> els(size);
    std::generate(els.begin(), els.end(), [](){return std::rand() % 1000;});

    auto now = std::chrono::high_resolution_clock::now();
    long duration_ms = std::chrono::duration_cast<std::chrono::milliseconds>(now - start_time).count();
    start_time = now;
    std::cerr << "Generate input: " << duration_ms << std::endl;

    rmq<std::vector<int>::iterator> rmq(els.begin(), els.end());

    now = std::chrono::high_resolution_clock::now();
    duration_ms = std::chrono::duration_cast<std::chrono::milliseconds>(now - start_time).count();
    std::cerr << "Construction RMQ: " << duration_ms << std::endl;

    int rand_tests = size;
    double rmq_queries = 0.0;
    double minel_queries = 0.0;
    start_time = std::chrono::high_resolution_clock::now();
    for (int i = 0; i < rand_tests; ++i)
    {
        // get random range and start timing
        int range_start = std::rand() % (size - 2);
        int range_end = std::rand() % (size - range_start - 1) + range_start;

        // query RMQ
        auto min = rmq.query(els.begin()+range_start, els.begin()+range_end);

        // stop timing
        //now = std::chrono::high_resolution_clock::now();
        //duration_ms = std::chrono::duration_cast<std::chrono::milliseconds>(now - start_time).count();
        //rmq_queries += duration_ms;
        //start_time = now;

        // use linear std::min_element
        auto min2 = std::min_element(els.begin()+range_start, els.begin() + range_end);

        // stop time
        //now = std::chrono::high_resolution_clock::now();
        //duration_ms = std::chrono::duration_cast<std::chrono::milliseconds>(now - start_time).count();
        //minel_queries += duration_ms;

        if (*min != *min2)
        {
            std::cerr << "ERROR: different mins for range(" << range_start << "," << range_end << ")" << std::endl;
            std::cerr << "rmq at " << min - els.begin() << " = " << *min << std::endl;
            std::cerr << "mne at " << min2 - els.begin() << " = " << *min2 << std::endl;
            exit(EXIT_FAILURE);
        }
        else
            std::cerr << "." << std::endl;
    }

    now = std::chrono::high_resolution_clock::now();
    duration_ms = std::chrono::duration_cast<std::chrono::milliseconds>(now - start_time).count();
    std::cout << "RMQ              queries total time: " << duration_ms/1000.0 << "s" << std::endl;
    //std::cout << "std::min_element queries total time: " << minel_queries/1000.0 << "s" << std::endl;
}